

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

int lj_cparse_case(GCstr *str,char *match)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *__s1;
  
  cVar2 = *match;
  if (cVar2 != '\0') {
    uVar1 = str->len;
    iVar4 = 0;
    do {
      __s1 = match + 1;
      uVar5 = (uint)cVar2;
      if ((uVar1 == uVar5) && (iVar3 = bcmp(__s1,str + 1,(ulong)uVar1), iVar3 == 0)) {
        return iVar4;
      }
      iVar4 = iVar4 + 1;
      cVar2 = __s1[uVar5];
      match = __s1 + uVar5;
    } while (cVar2 != '\0');
  }
  return -1;
}

Assistant:

int lj_cparse_case(GCstr *str, const char *match)
{
  MSize len;
  int n;
  for  (n = 0; (len = (MSize)*match++); n++, match += len) {
    if (str->len == len && !memcmp(match, strdata(str), len))
      return n;
  }
  return -1;
}